

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConnection.cpp
# Opt level: O0

void __thiscall
FIX::HttpConnection::processRoot
          (HttpConnection *this,HttpMessage *request,stringstream *h,stringstream *b)

{
  bool bVar1;
  TABLE *pTVar2;
  TAG *pTVar3;
  ostream *poVar4;
  size_t sVar5;
  reference sessionID_00;
  Session *this_00;
  StringField *pSVar6;
  string *psVar7;
  long lVar8;
  char *pcVar9;
  SEQNUM local_2ec8;
  undefined1 local_2ec0 [8];
  TD td_13;
  undefined1 local_2d00 [8];
  TD td_12;
  undefined1 local_2b40 [8];
  TD td_11;
  char *local_2970;
  undefined1 local_2968 [8];
  TD td_10;
  undefined1 local_27a8 [8];
  TD td_9;
  undefined1 local_25e8 [8];
  TD td_8;
  undefined1 local_2410 [8];
  A a_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_21f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_21d8;
  undefined1 local_21b8 [8];
  string href;
  TD td_7;
  TR tr_1;
  Session *pSession;
  SessionID *sessionID;
  iterator __end1;
  iterator __begin1;
  set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *__range1;
  set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> sessions;
  string local_1dc8;
  undefined1 local_1da8 [8];
  TD td_6;
  string local_1be8;
  undefined1 local_1bc8 [8];
  TD td_5;
  string local_1a08;
  undefined1 local_19e8 [8];
  TD td_4;
  string local_1828;
  undefined1 local_1808 [8];
  TD td_3;
  string local_1648;
  undefined1 local_1628 [8];
  TD td_2;
  string local_1468;
  undefined1 local_1448 [8];
  TD td_1;
  string local_1288;
  undefined1 local_1268 [8];
  TD td;
  TR tr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ed8;
  undefined1 local_eb8 [8];
  A a_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ce0;
  undefined1 local_cc0 [8];
  A a_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ae8;
  undefined1 local_ac8 [8];
  A a_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f0;
  undefined1 local_8d0 [8];
  A a;
  HR hr;
  EM em;
  CAPTION caption;
  undefined1 local_1e0 [8];
  TABLE table;
  stringstream *b_local;
  stringstream *h_local;
  HttpMessage *request_local;
  HttpConnection *this_local;
  
  table.super_TAG.m_stream = (ostream *)b;
  HTML::TABLE::TABLE((TABLE *)local_1e0,(ostream *)(b + 0x10));
  pTVar2 = HTML::TABLE::border((TABLE *)local_1e0,1);
  pTVar2 = HTML::TABLE::cellspacing(pTVar2,2);
  pTVar3 = &HTML::TABLE::width(pTVar2,100)->super_TAG;
  HTML::TAG::text(pTVar3);
  HTML::CAPTION::CAPTION((CAPTION *)&em.super_TAG.m_stream,table.super_TAG.m_stream + 0x10);
  HTML::TAG::text((TAG *)&em.super_TAG.m_stream);
  HTML::EM::EM((EM *)&hr.super_TAG.m_stream,table.super_TAG.m_stream + 0x10);
  HTML::TAG::text((TAG *)&hr.super_TAG.m_stream);
  poVar4 = table.super_TAG.m_stream + 0x10;
  sVar5 = Session::numSessions();
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar5);
  std::operator<<(poVar4," Sessions managed by QuickFIX");
  HTML::HR::HR((HR *)&a.super_TAG.m_stream,table.super_TAG.m_stream + 0x10);
  HTML::TAG::text((TAG *)&a.super_TAG.m_stream);
  HTML::HR::~HR((HR *)&a.super_TAG.m_stream);
  std::operator<<(table.super_TAG.m_stream + 0x10,HTML::NBSP);
  HTML::A::A((A *)local_8d0,table.super_TAG.m_stream + 0x10);
  HttpMessage::getParameterString_abi_cxx11_((string *)&a_1.super_TAG.m_stream,request);
  std::operator+(&local_8f0,"/resetSessions",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &a_1.super_TAG.m_stream);
  pTVar3 = &HTML::A::href((A *)local_8d0,&local_8f0)->super_TAG;
  HTML::TAG::text<char[6]>(pTVar3,(char (*) [6])"RESET");
  std::__cxx11::string::~string((string *)&local_8f0);
  std::__cxx11::string::~string((string *)&a_1.super_TAG.m_stream);
  HTML::A::~A((A *)local_8d0);
  std::operator<<(table.super_TAG.m_stream + 0x10,HTML::NBSP);
  HTML::A::A((A *)local_ac8,table.super_TAG.m_stream + 0x10);
  HttpMessage::getParameterString_abi_cxx11_((string *)&a_2.super_TAG.m_stream,request);
  std::operator+(&local_ae8,"/refreshSessions",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &a_2.super_TAG.m_stream);
  pTVar3 = &HTML::A::href((A *)local_ac8,&local_ae8)->super_TAG;
  HTML::TAG::text<char[8]>(pTVar3,(char (*) [8])"REFRESH");
  std::__cxx11::string::~string((string *)&local_ae8);
  std::__cxx11::string::~string((string *)&a_2.super_TAG.m_stream);
  HTML::A::~A((A *)local_ac8);
  std::operator<<(table.super_TAG.m_stream + 0x10,HTML::NBSP);
  HTML::A::A((A *)local_cc0,table.super_TAG.m_stream + 0x10);
  HttpMessage::getParameterString_abi_cxx11_((string *)&a_3.super_TAG.m_stream,request);
  std::operator+(&local_ce0,"/enableSessions",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &a_3.super_TAG.m_stream);
  pTVar3 = &HTML::A::href((A *)local_cc0,&local_ce0)->super_TAG;
  HTML::TAG::text<char[7]>(pTVar3,(char (*) [7])"ENABLE");
  std::__cxx11::string::~string((string *)&local_ce0);
  std::__cxx11::string::~string((string *)&a_3.super_TAG.m_stream);
  HTML::A::~A((A *)local_cc0);
  std::operator<<(table.super_TAG.m_stream + 0x10,HTML::NBSP);
  HTML::A::A((A *)local_eb8,table.super_TAG.m_stream + 0x10);
  HttpMessage::getParameterString_abi_cxx11_((string *)&tr.super_TAG.m_stream,request);
  std::operator+(&local_ed8,"/disableSessions",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &tr.super_TAG.m_stream);
  pTVar3 = &HTML::A::href((A *)local_eb8,&local_ed8)->super_TAG;
  HTML::TAG::text<char[8]>(pTVar3,(char (*) [8])"DISABLE");
  std::__cxx11::string::~string((string *)&local_ed8);
  std::__cxx11::string::~string((string *)&tr.super_TAG.m_stream);
  HTML::A::~A((A *)local_eb8);
  HTML::EM::~EM((EM *)&hr.super_TAG.m_stream);
  HTML::CAPTION::~CAPTION((CAPTION *)&em.super_TAG.m_stream);
  HTML::TR::TR((TR *)&td.super_TAG.m_stream,table.super_TAG.m_stream + 0x10);
  HTML::TAG::text((TAG *)&td.super_TAG.m_stream);
  HTML::TD::TD((TD *)local_1268,table.super_TAG.m_stream + 0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1288,"center",(allocator<char> *)((long)&td_1.super_TAG.m_stream + 7))
  ;
  pTVar3 = &HTML::TD::align((TD *)local_1268,&local_1288)->super_TAG;
  HTML::TAG::text<char[8]>(pTVar3,(char (*) [8])0x2dbd09);
  std::__cxx11::string::~string((string *)&local_1288);
  std::allocator<char>::~allocator((allocator<char> *)((long)&td_1.super_TAG.m_stream + 7));
  HTML::TD::~TD((TD *)local_1268);
  HTML::TD::TD((TD *)local_1448,table.super_TAG.m_stream + 0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1468,"center",(allocator<char> *)((long)&td_2.super_TAG.m_stream + 7))
  ;
  pTVar3 = &HTML::TD::align((TD *)local_1448,&local_1468)->super_TAG;
  HTML::TAG::text<char[15]>(pTVar3,(char (*) [15])0x2e2ec7);
  std::__cxx11::string::~string((string *)&local_1468);
  std::allocator<char>::~allocator((allocator<char> *)((long)&td_2.super_TAG.m_stream + 7));
  HTML::TD::~TD((TD *)local_1448);
  HTML::TD::TD((TD *)local_1628,table.super_TAG.m_stream + 0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1648,"center",(allocator<char> *)((long)&td_3.super_TAG.m_stream + 7))
  ;
  pTVar3 = &HTML::TD::align((TD *)local_1628,&local_1648)->super_TAG;
  HTML::TAG::text<char[8]>(pTVar3,(char (*) [8])"Enabled");
  std::__cxx11::string::~string((string *)&local_1648);
  std::allocator<char>::~allocator((allocator<char> *)((long)&td_3.super_TAG.m_stream + 7));
  HTML::TD::~TD((TD *)local_1628);
  HTML::TD::TD((TD *)local_1808,table.super_TAG.m_stream + 0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1828,"center",(allocator<char> *)((long)&td_4.super_TAG.m_stream + 7))
  ;
  pTVar3 = &HTML::TD::align((TD *)local_1808,&local_1828)->super_TAG;
  HTML::TAG::text<char[13]>(pTVar3,(char (*) [13])"Session Time");
  std::__cxx11::string::~string((string *)&local_1828);
  std::allocator<char>::~allocator((allocator<char> *)((long)&td_4.super_TAG.m_stream + 7));
  HTML::TD::~TD((TD *)local_1808);
  HTML::TD::TD((TD *)local_19e8,table.super_TAG.m_stream + 0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a08,"center",(allocator<char> *)((long)&td_5.super_TAG.m_stream + 7))
  ;
  pTVar3 = &HTML::TD::align((TD *)local_19e8,&local_1a08)->super_TAG;
  HTML::TAG::text<char[10]>(pTVar3,(char (*) [10])"Logged On");
  std::__cxx11::string::~string((string *)&local_1a08);
  std::allocator<char>::~allocator((allocator<char> *)((long)&td_5.super_TAG.m_stream + 7));
  HTML::TD::~TD((TD *)local_19e8);
  HTML::TD::TD((TD *)local_1bc8,table.super_TAG.m_stream + 0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1be8,"center",(allocator<char> *)((long)&td_6.super_TAG.m_stream + 7))
  ;
  pTVar3 = &HTML::TD::align((TD *)local_1bc8,&local_1be8)->super_TAG;
  HTML::TAG::text<char[14]>(pTVar3,(char (*) [14])"Next Incoming");
  std::__cxx11::string::~string((string *)&local_1be8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&td_6.super_TAG.m_stream + 7));
  HTML::TD::~TD((TD *)local_1bc8);
  HTML::TD::TD((TD *)local_1da8,table.super_TAG.m_stream + 0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1dc8,"center",
             (allocator<char> *)
             ((long)&sessions._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  pTVar3 = &HTML::TD::align((TD *)local_1da8,&local_1dc8)->super_TAG;
  HTML::TAG::text<char[14]>(pTVar3,(char (*) [14])"Next Outgoing");
  std::__cxx11::string::~string((string *)&local_1dc8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&sessions._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  HTML::TD::~TD((TD *)local_1da8);
  HTML::TR::~TR((TR *)&td.super_TAG.m_stream);
  Session::getSessions();
  __end1 = std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::
           begin((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *)
                 &__range1);
  sessionID = (SessionID *)
              std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::
              end((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *
                  )&__range1);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&sessionID), bVar1) {
    sessionID_00 = std::_Rb_tree_const_iterator<FIX::SessionID>::operator*(&__end1);
    this_00 = Session::lookupSession(sessionID_00);
    if (this_00 != (Session *)0x0) {
      HTML::TR::TR((TR *)&td_7.super_TAG.m_stream,table.super_TAG.m_stream + 0x10);
      HTML::TAG::text((TAG *)&td_7.super_TAG.m_stream);
      HTML::TD::TD((TD *)((long)&href.field_2 + 8),table.super_TAG.m_stream + 0x10);
      HTML::TAG::text((TAG *)((long)&href.field_2 + 8));
      pSVar6 = &SessionID::getBeginString(sessionID_00)->super_StringField;
      psVar7 = StringField::getValue_abi_cxx11_(pSVar6);
      std::operator+(&local_2238,"/session?BeginString=",psVar7);
      std::operator+(&local_2218,&local_2238,"&SenderCompID=");
      pSVar6 = &SessionID::getSenderCompID(sessionID_00)->super_StringField;
      psVar7 = StringField::getValue_abi_cxx11_(pSVar6);
      std::operator+(&local_21f8,&local_2218,psVar7);
      std::operator+(&local_21d8,&local_21f8,"&TargetCompID=");
      pSVar6 = &SessionID::getTargetCompID(sessionID_00)->super_StringField;
      psVar7 = StringField::getValue_abi_cxx11_(pSVar6);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_21b8
                     ,&local_21d8,psVar7);
      std::__cxx11::string::~string((string *)&local_21d8);
      std::__cxx11::string::~string((string *)&local_21f8);
      std::__cxx11::string::~string((string *)&local_2218);
      std::__cxx11::string::~string((string *)&local_2238);
      SessionID::getSessionQualifier_abi_cxx11_(sessionID_00);
      lVar8 = std::__cxx11::string::size();
      if (lVar8 != 0) {
        psVar7 = SessionID::getSessionQualifier_abi_cxx11_(sessionID_00);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &a_4.super_TAG.m_stream,"&SessionQualifier=",psVar7);
        std::__cxx11::string::operator+=((string *)local_21b8,(string *)&a_4.super_TAG.m_stream);
        std::__cxx11::string::~string((string *)&a_4.super_TAG.m_stream);
      }
      HTML::A::A((A *)local_2410,table.super_TAG.m_stream + 0x10);
      pTVar3 = &HTML::A::href((A *)local_2410,(string *)local_21b8)->super_TAG;
      SessionID::toString_abi_cxx11_((string *)&td_8.super_TAG.m_stream,sessionID_00);
      HTML::TAG::text<std::__cxx11::string>
                (pTVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &td_8.super_TAG.m_stream);
      std::__cxx11::string::~string((string *)&td_8.super_TAG.m_stream);
      HTML::A::~A((A *)local_2410);
      std::__cxx11::string::~string((string *)local_21b8);
      HTML::TD::~TD((TD *)((long)&href.field_2 + 8));
      HTML::TD::TD((TD *)local_25e8,table.super_TAG.m_stream + 0x10);
      bVar1 = Session::isInitiator(this_00);
      pcVar9 = "No sessions defined for acceptor";
      if (bVar1) {
        pcVar9 = "No sessions defined for initiator";
      }
      td_9.super_TAG.m_stream = (ostream *)(pcVar9 + 0x18);
      HTML::TAG::text<char_const*>((TAG *)local_25e8,(char **)&td_9.super_TAG.m_stream);
      HTML::TD::~TD((TD *)local_25e8);
      HTML::TD::TD((TD *)local_27a8,table.super_TAG.m_stream + 0x10);
      bVar1 = Session::isEnabled(this_00);
      pcVar9 = "no";
      if (bVar1) {
        pcVar9 = "yes";
      }
      td_10.super_TAG.m_stream = (ostream *)pcVar9;
      HTML::TAG::text<char_const*>((TAG *)local_27a8,(char **)&td_10.super_TAG.m_stream);
      HTML::TD::~TD((TD *)local_27a8);
      HTML::TD::TD((TD *)local_2968,table.super_TAG.m_stream + 0x10);
      UtcTimeStamp::now();
      bVar1 = Session::isSessionTime(this_00,(UtcTimeStamp *)&td_11.super_TAG.m_stream);
      local_2970 = "no";
      if (bVar1) {
        local_2970 = "yes";
      }
      HTML::TAG::text<char_const*>((TAG *)local_2968,&local_2970);
      UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&td_11.super_TAG.m_stream);
      HTML::TD::~TD((TD *)local_2968);
      HTML::TD::TD((TD *)local_2b40,table.super_TAG.m_stream + 0x10);
      bVar1 = Session::isLoggedOn(this_00);
      pcVar9 = "no";
      if (bVar1) {
        pcVar9 = "yes";
      }
      td_12.super_TAG.m_stream = (ostream *)pcVar9;
      HTML::TAG::text<char_const*>((TAG *)local_2b40,(char **)&td_12.super_TAG.m_stream);
      HTML::TD::~TD((TD *)local_2b40);
      HTML::TD::TD((TD *)local_2d00,table.super_TAG.m_stream + 0x10);
      td_13.super_TAG.m_stream = (ostream *)Session::getExpectedTargetNum(this_00);
      HTML::TAG::text<unsigned_long>((TAG *)local_2d00,(unsigned_long *)&td_13.super_TAG.m_stream);
      HTML::TD::~TD((TD *)local_2d00);
      HTML::TD::TD((TD *)local_2ec0,table.super_TAG.m_stream + 0x10);
      local_2ec8 = Session::getExpectedSenderNum(this_00);
      HTML::TAG::text<unsigned_long>((TAG *)local_2ec0,&local_2ec8);
      HTML::TD::~TD((TD *)local_2ec0);
      HTML::TR::~TR((TR *)&td_7.super_TAG.m_stream);
    }
    std::_Rb_tree_const_iterator<FIX::SessionID>::operator++(&__end1);
  }
  std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::~set
            ((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *)
             &__range1);
  HTML::TABLE::~TABLE((TABLE *)local_1e0);
  return;
}

Assistant:

void HttpConnection::processRoot(const HttpMessage &request, std::stringstream &h, std::stringstream &b) {
  TABLE table(b);
  table.border(1).cellspacing(2).width(100).text();

  {
    CAPTION caption(b);
    caption.text();
    EM em(b);
    em.text();
    b << Session::numSessions() << " Sessions managed by QuickFIX";
    {
      HR hr(b);
      hr.text();
    }
    {
      b << NBSP;
      A a(b);
      a.href("/resetSessions" + request.getParameterString()).text("RESET");
    }
    {
      b << NBSP;
      A a(b);
      a.href("/refreshSessions" + request.getParameterString()).text("REFRESH");
    }
    {
      b << NBSP;
      A a(b);
      a.href("/enableSessions" + request.getParameterString()).text("ENABLE");
    }
    {
      b << NBSP;
      A a(b);
      a.href("/disableSessions" + request.getParameterString()).text("DISABLE");
    }
  }

  {
    TR tr(b);
    tr.text();
    {
      TD td(b);
      td.align("center").text("Session");
    }
    {
      TD td(b);
      td.align("center").text("ConnectionType");
    }
    {
      TD td(b);
      td.align("center").text("Enabled");
    }
    {
      TD td(b);
      td.align("center").text("Session Time");
    }
    {
      TD td(b);
      td.align("center").text("Logged On");
    }
    {
      TD td(b);
      td.align("center").text("Next Incoming");
    }
    {
      TD td(b);
      td.align("center").text("Next Outgoing");
    }
  }

  std::set<SessionID> sessions = Session::getSessions();
  for (const SessionID &sessionID : sessions) {
    Session *pSession = Session::lookupSession(sessionID);
    if (!pSession) {
      continue;
    }

    {
      TR tr(b);
      tr.text();
      {
        TD td(b);
        td.text();
        std::string href = "/session?BeginString=" + sessionID.getBeginString().getValue()
                           + "&SenderCompID=" + sessionID.getSenderCompID().getValue()
                           + "&TargetCompID=" + sessionID.getTargetCompID().getValue();
        if (sessionID.getSessionQualifier().size()) {
          href += "&SessionQualifier=" + sessionID.getSessionQualifier();
        }

        A a(b);
        a.href(href).text(sessionID.toString());
      }
      {
        TD td(b);
        td.text(pSession->isInitiator() ? "initiator" : "acceptor");
      }
      {
        TD td(b);
        td.text(pSession->isEnabled() ? "yes" : "no");
      }
      {
        TD td(b);
        td.text(pSession->isSessionTime(UtcTimeStamp::now()) ? "yes" : "no");
      }
      {
        TD td(b);
        td.text(pSession->isLoggedOn() ? "yes" : "no");
      }
      {
        TD td(b);
        td.text(pSession->getExpectedTargetNum());
      }
      {
        TD td(b);
        td.text(pSession->getExpectedSenderNum());
      }
    }
  }
}